

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_data.hpp
# Opt level: O2

void duckdb::
     ArrowScalarBaseData<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::ArrowScalarConverter>::
     Append(ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  idx_t iVar1;
  undefined8 uVar2;
  ArrowBuffer *this;
  data_ptr_t pdVar3;
  ulong uVar4;
  long lVar5;
  idx_t i;
  UnifiedVectorFormat format;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,input_size,&local_78);
  AppendValidity(append_data,&local_78,from,to);
  this = ArrowAppendData::GetMainBuffer(append_data);
  lVar5 = to - from;
  ArrowBuffer::resize(this,lVar5 * 0x10 + this->count);
  pdVar3 = this->dataptr;
  for (; from < to; from = from + 1) {
    uVar4 = from;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)(local_78.sel)->sel_vector[from];
    }
    iVar1 = append_data->row_count;
    uVar2 = *(undefined8 *)(local_78.data + uVar4 * 0x10 + 8);
    *(undefined8 *)(pdVar3 + iVar1 * 0x10) = *(undefined8 *)(local_78.data + uVar4 * 0x10);
    *(undefined8 *)(pdVar3 + iVar1 * 0x10 + 8) = uVar2;
    pdVar3 = pdVar3 + 0x10;
  }
  append_data->row_count = append_data->row_count + lVar5;
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		D_ASSERT(to >= from);
		idx_t size = to - from;
		D_ASSERT(size <= input_size);
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);

		// append the validity mask
		AppendValidity(append_data, format, from, to);

		// append the main data
		auto &main_buffer = append_data.GetMainBuffer();
		main_buffer.resize(main_buffer.size() + sizeof(TGT) * size);
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto result_data = main_buffer.GetData<TGT>();

		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto result_idx = append_data.row_count + i - from;

			if (OP::SkipNulls() && !format.validity.RowIsValid(source_idx)) {
				OP::template SetNull<TGT>(result_data[result_idx]);
				continue;
			}
			result_data[result_idx] = OP::template Operation<TGT, SRC>(data[source_idx]);
		}
		append_data.row_count += size;
	}